

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_characters.h
# Opt level: O1

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,3ul>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               characters_t<char,_3UL> *fmt)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = (fmt->value).m_length == 0;
  if ((!bVar3) && (sVar1 = pos->m_position, end->m_position != sVar1)) {
    uVar2 = 0;
    while (pos->m_cache[sVar1] == (fmt->value).m_data._M_elems[uVar2]) {
      uVar2 = uVar2 + 1;
      iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
      bVar3 = (fmt->value).m_length <= uVar2;
      if (bVar3) {
        return bVar3;
      }
      sVar1 = pos->m_position;
      if (end->m_position == sVar1) {
        return bVar3;
      }
    }
  }
  return bVar3;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, const characters_t<Char, Length>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    for (std::size_t i = 0; i < fmt.value.length(); ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        if (ch != fmt.value[i])
            return false;
    }

    return read_impl(pos, end, std::forward<Others>(others)...);
}